

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1612e9d::AV1LbdInvTxfm2d_match_Test::TestBody(AV1LbdInvTxfm2d_match_Test *this)

{
  bool bVar1;
  int i;
  int iVar2;
  int j;
  int iVar3;
  
  for (iVar3 = 0; iVar3 != 0x13; iVar3 = iVar3 + 1) {
    for (iVar2 = 0; iVar2 != 0x10; iVar2 = iVar2 + 1) {
      bVar1 = libaom_test::IsTxSizeTypeValid((TX_SIZE)iVar3,(TX_TYPE)iVar2);
      if (bVar1) {
        AV1LbdInvTxfm2d::RunAV1InvTxfm2dTest
                  (&this->super_AV1LbdInvTxfm2d,(TX_TYPE)iVar2,(TX_SIZE)iVar3,1,0);
      }
    }
  }
  return;
}

Assistant:

TEST_P(AV1LbdInvTxfm2d, match) {
  for (int j = 0; j < (int)(TX_SIZES_ALL); ++j) {
    for (int i = 0; i < (int)TX_TYPES; ++i) {
      if (libaom_test::IsTxSizeTypeValid(static_cast<TxSize>(j),
                                         static_cast<TxType>(i))) {
        RunAV1InvTxfm2dTest(static_cast<TxType>(i), static_cast<TxSize>(j), 1);
      }
    }
  }
}